

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> __thiscall
xemmai::t_parser::f_unary(t_parser *this,bool a_assignable)

{
  t_lexer *this_00;
  int iVar1;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  undefined8 *puVar5;
  t_script *ptVar6;
  long lVar7;
  undefined7 in_register_00000031;
  size_t a_indent;
  t_node *a_target;
  wchar_t wVar8;
  t_at at;
  undefined1 local_68 [40];
  FILE *pFStack_40;
  
  a_indent = CONCAT71(in_register_00000031,a_assignable);
  this_00 = (t_lexer *)(a_indent + 8);
  a_target = (t_node *)((*(long *)(a_indent + 0x78) - *(long *)(a_indent + 0x70)) + -0x50 >> 2);
  iVar1 = *(int *)(a_indent + 0x88);
  if (iVar1 < 10) {
    if (iVar1 == 1) {
      local_68._16_8_ = *(size_type *)(a_indent + 0x60);
      local_68._0_8_ = *(undefined8 *)(a_indent + 0x50);
      local_68._8_8_ = *(size_type *)(a_indent + 0x58);
      t_lexer::f_next(this_00);
      wVar8 = L'7';
      goto LAB_0016a11a;
    }
    if (iVar1 != 8) {
LAB_0016a048:
      f_target((t_parser *)local_68,a_assignable);
      f_action(this,a_indent,
               (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
               a_target,SUB81((t_parser *)local_68,0));
      if ((t_script *)local_68._0_8_ == (t_script *)0x0) {
        return (__uniq_ptr_data<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>,_true,_true>
                )(__uniq_ptr_data<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>,_true,_true>
                  )this;
      }
      (*((t_body *)local_68._0_8_)->_vptr_t_body[1])();
      return (__uniq_ptr_data<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>,_true,_true>
              )(__uniq_ptr_data<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>,_true,_true>
                )this;
    }
    wVar8 = L'1';
    bVar4 = false;
  }
  else {
    if (iVar1 == 0x1a) {
      local_68._16_8_ = *(size_type *)(a_indent + 0x60);
      local_68._0_8_ = *(undefined8 *)(a_indent + 0x50);
      local_68._8_8_ = *(size_type *)(a_indent + 0x58);
      t_lexer::f_next(this_00);
      wVar8 = L':';
      if (*(int *)(a_indent + 0x88) != 0x2a) goto LAB_0016a11a;
      uVar3 = *(ulong *)(a_indent + 0xa8);
      t_lexer::f_next(this_00);
      puVar5 = (undefined8 *)operator_new(0x28);
      puVar5[1] = local_68._0_8_;
      puVar5[2] = local_68._8_8_;
      puVar5[3] = local_68._16_8_;
      *puVar5 = &PTR__t_node_0019b458;
      puVar5[4] = ~uVar3;
      goto LAB_0016a1bc;
    }
    if (iVar1 != 10) goto LAB_0016a048;
    wVar8 = L'4';
    bVar4 = true;
  }
  local_68._16_8_ = *(size_type *)(a_indent + 0x60);
  local_68._0_8_ = *(undefined8 *)(a_indent + 0x50);
  local_68._8_8_ = *(size_type *)(a_indent + 0x58);
  t_lexer::f_next(this_00);
  if (*(int *)(a_indent + 0x88) == 0x2b) {
    local_68._32_8_ = *(undefined8 *)(a_indent + 0xa8);
    pFStack_40 = (FILE *)0x0;
    t_lexer::f_next(this_00);
    puVar5 = (undefined8 *)operator_new(0x28);
    wVar8 = local_68._36_4_;
    if (bVar4) {
      wVar8 = local_68._36_4_ ^ 0x80000000;
    }
    puVar5[1] = local_68._0_8_;
    puVar5[2] = local_68._8_8_;
    puVar5[3] = local_68._16_8_;
    *puVar5 = &PTR__t_node_0019b4a0;
    puVar5[4] = CONCAT44(wVar8,local_68._32_4_);
  }
  else {
    if (*(int *)(a_indent + 0x88) != 0x2a) {
LAB_0016a11a:
      f_unary((t_parser *)(local_68 + 0x18),a_assignable);
      ptVar6 = (t_script *)operator_new(0x30);
      (ptVar6->v_path).field_2._M_allocated_capacity = local_68._16_8_;
      (ptVar6->v_path)._M_dataplus._M_p = (pointer)local_68._0_8_;
      (ptVar6->v_path)._M_string_length = local_68._8_8_;
      (ptVar6->super_t_body)._vptr_t_body = (_func_int **)&PTR__t_unary_0019b208;
      (ptVar6->v_path).field_2._M_local_buf[2] = wVar8;
      (ptVar6->v_slots).super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>._M_impl.
      super__Deque_impl_data._M_map = (_Map_pointer)local_68._24_8_;
      this->v_module = ptVar6;
      return (__uniq_ptr_data<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>,_true,_true>
              )(__uniq_ptr_data<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>,_true,_true>
                )this;
    }
    lVar2 = *(long *)(a_indent + 0xa8);
    t_lexer::f_next(this_00);
    puVar5 = (undefined8 *)operator_new(0x28);
    lVar7 = -lVar2;
    if (!bVar4) {
      lVar7 = lVar2;
    }
    puVar5[1] = local_68._0_8_;
    puVar5[2] = local_68._8_8_;
    puVar5[3] = local_68._16_8_;
    *puVar5 = &PTR__t_node_0019b458;
    puVar5[4] = lVar7;
  }
LAB_0016a1bc:
  f_action(this,a_indent,a_target,SUB81(puVar5,0));
  return (__uniq_ptr_data<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>,_true,_true>
         )(__uniq_ptr_data<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>,_true,_true>
           )this;
}

Assistant:

std::unique_ptr<ast::t_node> t_parser::f_unary(bool a_assignable)
{
	size_t indent = v_lexer.f_indent();
	t_instruction instruction;
	switch (v_lexer.f_token()) {
	case t_lexer::c_token__PLUS:
		instruction = c_instruction__PLUS_T;
		break;
	case t_lexer::c_token__HYPHEN:
		instruction = c_instruction__MINUS_T;
		break;
	case t_lexer::c_token__EXCLAMATION:
		instruction = c_instruction__NOT_T;
		break;
	case t_lexer::c_token__TILDE:
		instruction = c_instruction__COMPLEMENT_T;
		break;
	default:
		return f_action(indent, f_target(a_assignable), a_assignable);
	}
	t_at at = v_lexer.f_at();
	v_lexer.f_next();
	switch (instruction) {
	case c_instruction__PLUS_T:
	case c_instruction__MINUS_T:
		switch (v_lexer.f_token()) {
		case t_lexer::c_token__INTEGER:
			{
				auto value = v_lexer.f_integer();
				v_lexer.f_next();
				return f_action(indent, new ast::t_literal(at, instruction == c_instruction__MINUS_T ? -value : value), a_assignable);
			}
		case t_lexer::c_token__FLOAT:
			{
				auto value = v_lexer.f_float();
				v_lexer.f_next();
				return f_action(indent, new ast::t_literal(at, instruction == c_instruction__MINUS_T ? -value : value), a_assignable);
			}
		}
		break;
	case c_instruction__COMPLEMENT_T:
		if (v_lexer.f_token() == t_lexer::c_token__INTEGER) {
			auto value = v_lexer.f_integer();
			v_lexer.f_next();
			return f_action(indent, new ast::t_literal(at, ~value), a_assignable);
		}
		break;
	}
	return std::make_unique<ast::t_unary>(at, instruction, f_unary(false));
}